

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O1

uint32_t absl::base_internal::SpinLock::EncodeWaitCycles
                   (int64_t wait_start_time,int64_t wait_end_time)

{
  uint32_t uVar1;
  ulong uVar2;
  
  uVar2 = wait_end_time - wait_start_time >> 7;
  if (0x1ffffffe < (long)uVar2) {
    uVar2 = 0x1fffffff;
  }
  uVar1 = (int)uVar2 << 3;
  if ((uVar2 & 0x1fffffff) != 0) {
    if (uVar1 == 8) {
      uVar1 = 0x10;
    }
    return uVar1;
  }
  return 8;
}

Assistant:

uint32_t SpinLock::EncodeWaitCycles(int64_t wait_start_time,
                                    int64_t wait_end_time) {
  static const int64_t kMaxWaitTime =
      std::numeric_limits<uint32_t>::max() >> kLockwordReservedShift;
  int64_t scaled_wait_time =
      (wait_end_time - wait_start_time) >> kProfileTimestampShift;

  // Return a representation of the time spent waiting that can be stored in
  // the lock word's upper bits.
  uint32_t clamped = static_cast<uint32_t>(
      std::min(scaled_wait_time, kMaxWaitTime) << kLockwordReservedShift);

  if (clamped == 0) {
    return kSpinLockSleeper;  // Just wake waiters, but don't record contention.
  }
  // Bump up value if necessary to avoid returning kSpinLockSleeper.
  const uint32_t kMinWaitTime =
      kSpinLockSleeper + (1 << kLockwordReservedShift);
  if (clamped == kSpinLockSleeper) {
    return kMinWaitTime;
  }
  return clamped;
}